

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O0

int setup_xattr(archive_read_disk *a,archive_entry *entry,char *name,int fd,char *accpath)

{
  int *piVar1;
  void *local_48;
  void *value;
  ssize_t size;
  char *accpath_local;
  int fd_local;
  char *name_local;
  archive_entry *entry_local;
  archive_read_disk *a_local;
  
  local_48 = (void *)0x0;
  if (fd < 0) {
    if (a->follow_symlinks == '\0') {
      value = (void *)lgetxattr(accpath,name,(void *)0x0,0);
    }
    else {
      value = (void *)getxattr(accpath,name,(void *)0x0,0);
    }
  }
  else {
    value = (void *)fgetxattr(fd,name,(void *)0x0,0);
  }
  if (value == (void *)0xffffffffffffffff) {
    piVar1 = __errno_location();
    archive_set_error(&a->archive,*piVar1,"Couldn\'t query extended attribute");
    a_local._4_4_ = -0x14;
  }
  else if (((long)value < 1) || (local_48 = malloc((size_t)value), local_48 != (void *)0x0)) {
    if (fd < 0) {
      if (a->follow_symlinks == '\0') {
        value = (void *)lgetxattr(accpath,name,local_48,(size_t)value);
      }
      else {
        value = (void *)getxattr(accpath,name,local_48,(size_t)value);
      }
    }
    else {
      value = (void *)fgetxattr(fd,name,local_48,(size_t)value);
    }
    if (value == (void *)0xffffffffffffffff) {
      piVar1 = __errno_location();
      archive_set_error(&a->archive,*piVar1,"Couldn\'t read extended attribute");
      free(local_48);
      a_local._4_4_ = -0x14;
    }
    else {
      archive_entry_xattr_add_entry(entry,name,local_48,(size_t)value);
      free(local_48);
      a_local._4_4_ = 0;
    }
  }
  else {
    piVar1 = __errno_location();
    archive_set_error(&a->archive,*piVar1,"Out of memory");
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
setup_xattr(struct archive_read_disk *a,
    struct archive_entry *entry, const char *name, int fd, const char *accpath)
{
	ssize_t size;
	void *value = NULL;


	if (fd >= 0) {
#if ARCHIVE_XATTR_LINUX
		size = fgetxattr(fd, name, NULL, 0);
#elif ARCHIVE_XATTR_DARWIN
		size = fgetxattr(fd, name, NULL, 0, 0, 0);
#elif ARCHIVE_XATTR_AIX
		size = fgetea(fd, name, NULL, 0);
#endif
	} else if (!a->follow_symlinks) {
#if ARCHIVE_XATTR_LINUX
		size = lgetxattr(accpath, name, NULL, 0);
#elif ARCHIVE_XATTR_DARWIN
		size = getxattr(accpath, name, NULL, 0, 0, XATTR_NOFOLLOW);
#elif ARCHIVE_XATTR_AIX
		size = lgetea(accpath, name, NULL, 0);
#endif
	} else {
#if ARCHIVE_XATTR_LINUX
		size = getxattr(accpath, name, NULL, 0);
#elif ARCHIVE_XATTR_DARWIN
		size = getxattr(accpath, name, NULL, 0, 0, 0);
#elif ARCHIVE_XATTR_AIX
		size = getea(accpath, name, NULL, 0);
#endif
	}

	if (size == -1) {
		archive_set_error(&a->archive, errno,
		    "Couldn't query extended attribute");
		return (ARCHIVE_WARN);
	}

	if (size > 0 && (value = malloc(size)) == NULL) {
		archive_set_error(&a->archive, errno, "Out of memory");
		return (ARCHIVE_FATAL);
	}


	if (fd >= 0) {
#if ARCHIVE_XATTR_LINUX
		size = fgetxattr(fd, name, value, size);
#elif ARCHIVE_XATTR_DARWIN
		size = fgetxattr(fd, name, value, size, 0, 0);
#elif ARCHIVE_XATTR_AIX
		size = fgetea(fd, name, value, size);
#endif
	} else if (!a->follow_symlinks) {
#if ARCHIVE_XATTR_LINUX
		size = lgetxattr(accpath, name, value, size);
#elif ARCHIVE_XATTR_DARWIN
		size = getxattr(accpath, name, value, size, 0, XATTR_NOFOLLOW);
#elif ARCHIVE_XATTR_AIX
		size = lgetea(accpath, name, value, size);
#endif
	} else {
#if ARCHIVE_XATTR_LINUX
		size = getxattr(accpath, name, value, size);
#elif ARCHIVE_XATTR_DARWIN
		size = getxattr(accpath, name, value, size, 0, 0);
#elif ARCHIVE_XATTR_AIX
		size = getea(accpath, name, value, size);
#endif
	}

	if (size == -1) {
		archive_set_error(&a->archive, errno,
		    "Couldn't read extended attribute");
		free(value);
		return (ARCHIVE_WARN);
	}

	archive_entry_xattr_add_entry(entry, name, value, size);

	free(value);
	return (ARCHIVE_OK);
}